

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O2

void anon_unknown.dwarf_b3e6bd::ProcessMetadata
               (ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_1UL,_0UL> *set,
               ConversionData *conv,Metadata *properties,string *prefix,uint nest)

{
  undefined8 *puVar1;
  IfcProperty *pIVar2;
  IfcPropertySingleValue *pIVar3;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *psVar4;
  PrimitiveDataType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pPVar5;
  mapped_type *pmVar6;
  IfcPropertyListValue *pIVar7;
  ostream *poVar8;
  IfcComplexProperty *pIVar9;
  PrimitiveDataType<double> *pPVar10;
  PrimitiveDataType<long> *pPVar11;
  undefined1 *this;
  ulong uVar12;
  Out *v;
  undefined8 *puVar13;
  string value_1;
  string value;
  Metadata local_228;
  ConversionData *local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f0;
  Lazy *local_1e8;
  Lazy *local_1e0;
  string local_1d8 [32];
  undefined1 local_1b8 [392];
  
  local_1e0 = (Lazy *)(set->
                      super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
                      ).
                      super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
  local_1e8 = (Lazy *)(set->
                      super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
                      ).
                      super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
  local_228._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)prefix;
  local_1f8 = conv;
  local_1f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)properties;
  do {
    if (local_1e0 == local_1e8) {
      return;
    }
    pIVar2 = Assimp::STEP::Lazy::operator_cast_to_IfcProperty_(local_1e0);
    if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)properties)->
        _M_string_length == 0) {
      std::__cxx11::string::string
                ((string *)&local_228,
                 (string *)
                 &(pIVar2->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>).field_0x10
                );
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)properties
                     ,".");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_228
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &(pIVar2->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>).
                       field_0x10);
      std::__cxx11::string::~string((string *)local_1b8);
    }
    pIVar3 = Assimp::STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcPropertySingleValue>
                       ((Object *)
                        ((long)&(pIVar2->
                                super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>).
                                _vptr_ObjectHelper +
                        (long)(pIVar2->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>
                              )._vptr_ObjectHelper[-3]));
    if (pIVar3 == (IfcPropertySingleValue *)0x0) {
      pIVar7 = Assimp::STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcPropertyListValue>
                         ((Object *)
                          ((long)&(pIVar2->
                                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>).
                                  _vptr_ObjectHelper +
                          (long)(pIVar2->
                                super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>).
                                _vptr_ObjectHelper[-3]));
      if (pIVar7 != (IfcPropertyListValue *)0x0) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::operator<<((ostream *)(local_1b8 + 0x10),"[");
        puVar1 = *(undefined8 **)
                  &(pIVar7->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyListValue,_2UL>).
                   field_0x18;
        uVar12 = 0;
        for (puVar13 = *(undefined8 **)
                        &(pIVar7->
                         super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyListValue,_2UL>).
                         field_0x10; puVar13 != puVar1; puVar13 = puVar13 + 2) {
          if ((DataType *)*puVar13 != (DataType *)0x0) {
            pPVar5 = Assimp::STEP::EXPRESS::DataType::
                     ToPtr<Assimp::STEP::EXPRESS::PrimitiveDataType<std::__cxx11::string>>
                               ((DataType *)*puVar13);
            if (pPVar5 == (PrimitiveDataType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)0x0) {
              pPVar10 = Assimp::STEP::EXPRESS::DataType::
                        ToPtr<Assimp::STEP::EXPRESS::PrimitiveDataType<double>>
                                  ((DataType *)*puVar13);
              if (pPVar10 == (PrimitiveDataType<double> *)0x0) {
                pPVar11 = Assimp::STEP::EXPRESS::DataType::
                          ToPtr<Assimp::STEP::EXPRESS::PrimitiveDataType<long>>
                                    ((DataType *)*puVar13);
                if (pPVar11 != (PrimitiveDataType<long> *)0x0) {
                  std::ostream::_M_insert<long>((long)(local_1b8 + 0x10));
                }
              }
              else {
                std::ostream::operator<<(local_1b8 + 0x10,(float)pPVar10->val);
              }
            }
            else {
              std::__cxx11::string::string(local_1d8,(string *)&pPVar5->val);
              poVar8 = std::operator<<((ostream *)(local_1b8 + 0x10),"\'");
              poVar8 = std::operator<<(poVar8,local_1d8);
              std::operator<<(poVar8,"\'");
              std::__cxx11::string::~string(local_1d8);
            }
            uVar12 = (ulong)((int)uVar12 + 1);
            if (uVar12 < (ulong)(*(long *)&(pIVar7->
                                           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyListValue,_2UL>
                                           ).field_0x18 -
                                 *(long *)&(pIVar7->
                                           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyListValue,_2UL>
                                           ).field_0x10 >> 4)) {
              std::operator<<((ostream *)(local_1b8 + 0x10),",");
            }
          }
        }
        std::operator<<((ostream *)(local_1b8 + 0x10),"]");
        std::__cxx11::stringbuf::str();
        properties = (Metadata *)local_1f0;
        conv = local_1f8;
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_1f8,(key_type *)&local_228);
        goto LAB_0048a7ed;
      }
      pIVar9 = Assimp::STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcComplexProperty>
                         ((Object *)
                          ((long)&(pIVar2->
                                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>).
                                  _vptr_ObjectHelper +
                          (long)(pIVar2->
                                super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>).
                                _vptr_ObjectHelper[-3]));
      if (pIVar9 == (IfcComplexProperty *)0x0) {
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)conv,(key_type *)&local_228);
        std::__cxx11::string::assign((char *)pmVar6);
      }
      else if ((uint)local_228._M_t._M_impl.super__Rb_tree_header._M_header._M_right < 3) {
        ProcessMetadata(&pIVar9->HasProperties,conv,&local_228,(string *)(ulong)((int)prefix + 1),
                        nest);
      }
      else {
        Assimp::LogFunctions<Assimp::IFCImporter>::LogError((char *)0x48a6fc);
      }
    }
    else if ((pIVar3->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertySingleValue,_2UL>).
             field_0x20 == '\x01') {
      this = &(pIVar3->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertySingleValue,_2UL>).
              field_0x10;
      psVar4 = Assimp::STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Get
                         ((Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_> *)this);
      pPVar5 = Assimp::STEP::EXPRESS::DataType::
               ToPtr<Assimp::STEP::EXPRESS::PrimitiveDataType<std::__cxx11::string>>
                         ((psVar4->
                          super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr);
      if (pPVar5 == (PrimitiveDataType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x0) {
        psVar4 = Assimp::STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Get
                           ((Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_> *)this);
        pPVar10 = Assimp::STEP::EXPRESS::DataType::
                  ToPtr<Assimp::STEP::EXPRESS::PrimitiveDataType<double>>
                            ((psVar4->
                             super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr);
        if (pPVar10 == (PrimitiveDataType<double> *)0x0) {
          psVar4 = Assimp::STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Get
                             ((Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_> *)this
                             );
          pPVar11 = Assimp::STEP::EXPRESS::DataType::
                    ToPtr<Assimp::STEP::EXPRESS::PrimitiveDataType<long>>
                              ((psVar4->
                               super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr);
          if (pPVar11 == (PrimitiveDataType<long> *)0x0) goto LAB_0048a808;
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::ostream::_M_insert<long>((long)(local_1b8 + 0x10));
          std::__cxx11::stringbuf::str();
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)conv,(key_type *)&local_228);
        }
        else {
          local_228._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pPVar10->val;
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::ostream::operator<<
                    (local_1b8 + 0x10,
                     (float)(double)local_228._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::__cxx11::stringbuf::str();
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)conv,(key_type *)&local_228);
        }
LAB_0048a7ed:
        std::__cxx11::string::operator=((string *)pmVar6,local_1d8);
        std::__cxx11::string::~string(local_1d8);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      }
      else {
        std::__cxx11::string::string((string *)local_1b8,(string *)&pPVar5->val);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)conv,(key_type *)&local_228);
        std::__cxx11::string::_M_assign((string *)pmVar6);
        std::__cxx11::string::~string((string *)local_1b8);
      }
    }
LAB_0048a808:
    std::__cxx11::string::~string((string *)&local_228);
    local_1e0 = local_1e0 + 8;
  } while( true );
}

Assistant:

void ProcessMetadata(const Schema_2x3::ListOf< Schema_2x3::Lazy< Schema_2x3::IfcProperty >, 1, 0 >& set, ConversionData& conv, Metadata& properties,
        const std::string& prefix = "",
        unsigned int nest = 0) {
    for(const Schema_2x3::IfcProperty& property : set) {
        const std::string& key = prefix.length() > 0 ? (prefix + "." + property.Name) : property.Name;
        if (const Schema_2x3::IfcPropertySingleValue* const singleValue = property.ToPtr<Schema_2x3::IfcPropertySingleValue>()) {
            if (singleValue->NominalValue) {
                if (const ::Assimp::STEP::EXPRESS::STRING* str = singleValue->NominalValue.Get()->ToPtr<::Assimp::STEP::EXPRESS::STRING>()) {
                    std::string value = static_cast<std::string>(*str);
                    properties[key]=value;
                }
                else if (const ::Assimp::STEP::EXPRESS::REAL* val = singleValue->NominalValue.Get()->ToPtr<::Assimp::STEP::EXPRESS::REAL>()) {
                    float value = static_cast<float>(*val);
                    std::stringstream s;
                    s << value;
                    properties[key]=s.str();
                }
                else if (const ::Assimp::STEP::EXPRESS::INTEGER* val = singleValue->NominalValue.Get()->ToPtr<::Assimp::STEP::EXPRESS::INTEGER>()) {
                    int64_t value = static_cast<int64_t>(*val);
                    std::stringstream s;
                    s << value;
                    properties[key]=s.str();
                }
            }
        }
        else if (const Schema_2x3::IfcPropertyListValue* const listValue = property.ToPtr<Schema_2x3::IfcPropertyListValue>()) {
            std::stringstream ss;
            ss << "[";
            unsigned index=0;
            for(const Schema_2x3::IfcValue::Out& v : listValue->ListValues) {
                if (!v) continue;
                if (const ::Assimp::STEP::EXPRESS::STRING* str = v->ToPtr<::Assimp::STEP::EXPRESS::STRING>()) {
                    std::string value = static_cast<std::string>(*str);
                    ss << "'" << value << "'";
                }
                else if (const ::Assimp::STEP::EXPRESS::REAL* val = v->ToPtr<::Assimp::STEP::EXPRESS::REAL>()) {
                    float value = static_cast<float>(*val);
                    ss << value;
                }
                else if (const ::Assimp::STEP::EXPRESS::INTEGER* val = v->ToPtr<::Assimp::STEP::EXPRESS::INTEGER>()) {
                    int64_t value = static_cast<int64_t>(*val);
                    ss << value;
                }
                if (index+1<listValue->ListValues.size()) {
                    ss << ",";
                }
                index++;
            }
            ss << "]";
            properties[key]=ss.str();
        }
        else if (const Schema_2x3::IfcComplexProperty* const complexProp = property.ToPtr<Schema_2x3::IfcComplexProperty>()) {
            if(nest > 2) { // mostly arbitrary limit to prevent stack overflow vulnerabilities
                IFCImporter::LogError("maximum nesting level for IfcComplexProperty reached, skipping this property.");
            }
            else {
                ProcessMetadata(complexProp->HasProperties, conv, properties, key, nest + 1);
            }
        }
        else {
            properties[key]="";
        }
    }
}